

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O1

bool icu_63::numparse::impl::AffixMatcherWarehouse::isInteresting
               (AffixPatternProvider *patternInfo,IgnorablesMatcher *ignorables,
               parse_flags_t parseFlags,UErrorCode *status)

{
  bool bVar1;
  int iVar2;
  UnicodeSet *pUVar3;
  UnicodeString negSuffixString;
  UnicodeString negPrefixString;
  UnicodeString posSuffixString;
  UnicodeString posPrefixString;
  UnicodeString local_168;
  UnicodeString local_128;
  UnicodeString local_e8;
  UnicodeString local_a8;
  UnicodeString local_68;
  
  (*patternInfo->_vptr_AffixPatternProvider[4])(&local_68,patternInfo,0x100);
  (*patternInfo->_vptr_AffixPatternProvider[4])(&local_e8,patternInfo,0);
  local_128.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f7be0;
  local_128.fUnion.fStackFields.fLengthAndFlags = 2;
  local_168.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f7be0;
  local_168.fUnion.fStackFields.fLengthAndFlags = 2;
  iVar2 = (*patternInfo->_vptr_AffixPatternProvider[7])(patternInfo);
  if ((char)iVar2 != '\0') {
    (*patternInfo->_vptr_AffixPatternProvider[4])(&local_a8,patternInfo,0x300);
    UnicodeString::moveFrom(&local_128,&local_a8);
    UnicodeString::~UnicodeString(&local_a8);
    (*patternInfo->_vptr_AffixPatternProvider[4])(&local_a8,patternInfo,0x200);
    UnicodeString::moveFrom(&local_168,&local_a8);
    UnicodeString::~UnicodeString(&local_a8);
  }
  if (((uint)parseFlags >> 8 & 1) == 0) {
    pUVar3 = SymbolMatcher::getSet(&ignorables->super_SymbolMatcher);
    bVar1 = icu_63::number::impl::AffixUtils::containsOnlySymbolsAndIgnorables
                      (&local_68,pUVar3,status);
    if (bVar1) {
      pUVar3 = SymbolMatcher::getSet(&ignorables->super_SymbolMatcher);
      bVar1 = icu_63::number::impl::AffixUtils::containsOnlySymbolsAndIgnorables
                        (&local_e8,pUVar3,status);
      if (bVar1) {
        pUVar3 = SymbolMatcher::getSet(&ignorables->super_SymbolMatcher);
        bVar1 = icu_63::number::impl::AffixUtils::containsOnlySymbolsAndIgnorables
                          (&local_128,pUVar3,status);
        if (bVar1) {
          pUVar3 = SymbolMatcher::getSet(&ignorables->super_SymbolMatcher);
          bVar1 = icu_63::number::impl::AffixUtils::containsOnlySymbolsAndIgnorables
                            (&local_168,pUVar3,status);
          if (bVar1) {
            bVar1 = icu_63::number::impl::AffixUtils::containsType(&local_e8,TYPE_PLUS_SIGN,status);
            if (!bVar1) {
              bVar1 = icu_63::number::impl::AffixUtils::containsType
                                (&local_e8,TYPE_MINUS_SIGN,status);
              if (!bVar1) {
                bVar1 = icu_63::number::impl::AffixUtils::containsType
                                  (&local_168,TYPE_PLUS_SIGN,status);
                if (!bVar1) {
                  bVar1 = icu_63::number::impl::AffixUtils::containsType
                                    (&local_168,TYPE_MINUS_SIGN,status);
                  if (!bVar1) {
                    bVar1 = false;
                    goto LAB_0028c360;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar1 = true;
LAB_0028c360:
  UnicodeString::~UnicodeString(&local_168);
  UnicodeString::~UnicodeString(&local_128);
  UnicodeString::~UnicodeString(&local_e8);
  UnicodeString::~UnicodeString(&local_68);
  return bVar1;
}

Assistant:

bool AffixMatcherWarehouse::isInteresting(const AffixPatternProvider& patternInfo,
                                          const IgnorablesMatcher& ignorables, parse_flags_t parseFlags,
                                          UErrorCode& status) {
    UnicodeString posPrefixString = patternInfo.getString(AffixPatternProvider::AFFIX_POS_PREFIX);
    UnicodeString posSuffixString = patternInfo.getString(AffixPatternProvider::AFFIX_POS_SUFFIX);
    UnicodeString negPrefixString;
    UnicodeString negSuffixString;
    if (patternInfo.hasNegativeSubpattern()) {
        negPrefixString = patternInfo.getString(AffixPatternProvider::AFFIX_NEG_PREFIX);
        negSuffixString = patternInfo.getString(AffixPatternProvider::AFFIX_NEG_SUFFIX);
    }

    if (0 == (parseFlags & PARSE_FLAG_USE_FULL_AFFIXES) &&
        AffixUtils::containsOnlySymbolsAndIgnorables(posPrefixString, *ignorables.getSet(), status) &&
        AffixUtils::containsOnlySymbolsAndIgnorables(posSuffixString, *ignorables.getSet(), status) &&
        AffixUtils::containsOnlySymbolsAndIgnorables(negPrefixString, *ignorables.getSet(), status) &&
        AffixUtils::containsOnlySymbolsAndIgnorables(negSuffixString, *ignorables.getSet(), status)
        // HACK: Plus and minus sign are a special case: we accept them trailing only if they are
        // trailing in the pattern string.
        && !AffixUtils::containsType(posSuffixString, TYPE_PLUS_SIGN, status) &&
        !AffixUtils::containsType(posSuffixString, TYPE_MINUS_SIGN, status) &&
        !AffixUtils::containsType(negSuffixString, TYPE_PLUS_SIGN, status) &&
        !AffixUtils::containsType(negSuffixString, TYPE_MINUS_SIGN, status)) {
        // The affixes contain only symbols and ignorables.
        // No need to generate affix matchers.
        return false;
    }
    return true;
}